

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

VmValue * CompileVmReturn(ExpressionContext *ctx,VmModule *module,ExprReturn *node)

{
  VmModule *module_00;
  VmValue *in_RAX;
  VmValue *pVVar1;
  VmInstruction *value;
  VmInstructionType in_R9D;
  
  pVVar1 = CompileVm(ctx,module,node->value);
  if (node->coroutineStateUpdate != (ExprBase *)0x0) {
    CompileVm(ctx,module,node->coroutineStateUpdate);
  }
  if (node->closures != (ExprBase *)0x0) {
    CompileVm(ctx,module,node->closures);
  }
  module_00 = (VmModule *)(node->super_ExprBase).source;
  if (node->value->type == ctx->typeVoid) {
    value = anon_unknown.dwarf_20a43d::CreateInstruction
                      ((anon_unknown_dwarf_20a43d *)module,module_00,(SynBase *)0x0,
                       (VmType)(ZEXT816(0x20) << 0x40),in_R9D);
  }
  else {
    value = anon_unknown.dwarf_20a43d::CreateInstruction
                      ((anon_unknown_dwarf_20a43d *)module,module_00,(SynBase *)0x0,
                       (VmType)(ZEXT816(0x20) << 0x40),(VmInstructionType)pVVar1,in_RAX);
  }
  pVVar1 = anon_unknown.dwarf_20a43d::CheckType(ctx,&node->super_ExprBase,&value->super_VmValue);
  return pVVar1;
}

Assistant:

VmValue* CompileVmReturn(ExpressionContext &ctx, VmModule *module, ExprReturn *node)
{
	VmValue *value = CompileVm(ctx, module, node->value);

	if(node->coroutineStateUpdate)
		CompileVm(ctx, module, node->coroutineStateUpdate);

	if(node->closures)
		CompileVm(ctx, module, node->closures);

	if(node->value->type == ctx.typeVoid)
		return CheckType(ctx, node, CreateReturn(module, node->source));

	return CheckType(ctx, node, CreateReturn(module, node->source, value));
}